

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O1

int socketio_setoption(CONCRETE_IO_HANDLE socket_io,char *optionName,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int *piVar3;
  size_t sVar4;
  int iVar5;
  char *pcVar6;
  int __level;
  size_t __size;
  char *pcVar7;
  
  if (value == (void *)0x0 || (optionName == (char *)0x0 || socket_io == (CONCRETE_IO_HANDLE)0x0)) {
    return 0x4ba;
  }
  iVar1 = strcmp(optionName,"tcp_keepalive");
  if (iVar1 == 0) {
    iVar1 = *socket_io;
    __level = 1;
    iVar5 = 9;
  }
  else {
    iVar1 = strcmp(optionName,"tcp_keepalive_time");
    if (iVar1 == 0) {
      iVar1 = *socket_io;
      __level = 6;
      iVar5 = 4;
    }
    else {
      iVar1 = strcmp(optionName,"tcp_keepalive_interval");
      if (iVar1 != 0) {
        iVar1 = strcmp(optionName,"net_interface_mac_address");
        if (iVar1 == 0) {
          sVar4 = strlen((char *)value);
          if (sVar4 == 0) {
            p_Var2 = xlogging_get_log_function();
            iVar1 = 0x4dd;
            if (p_Var2 == (LOGGER_LOG)0x0) {
              return 0x4dd;
            }
            pcVar6 = "socketio_setoption";
            pcVar7 = "option value must be a valid mac address";
            iVar5 = 0x4dc;
          }
          else {
            __size = 0xffffffffffffffff;
            if (sVar4 + 1 != 0) {
              __size = sVar4 + 1;
            }
            if (__size == 0xffffffffffffffff) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"socketio_setoption",0x4e1,1,"invalid malloc size");
              }
              *(undefined8 *)((long)socket_io + 0x48) = 0;
              return 0x4e2;
            }
            pcVar6 = (char *)malloc(__size);
            *(char **)((long)socket_io + 0x48) = pcVar6;
            if (pcVar6 != (char *)0x0) {
              strcpy(pcVar6,(char *)value);
              strtoup(pcVar6);
              return 0;
            }
            p_Var2 = xlogging_get_log_function();
            iVar1 = 0x4e8;
            if (p_Var2 == (LOGGER_LOG)0x0) {
              return 0x4e8;
            }
            pcVar6 = "socketio_setoption";
            pcVar7 = "failed setting net_interface_mac_address option (malloc failed)";
            iVar5 = 0x4e7;
          }
        }
        else {
          iVar1 = strcmp(optionName,"ADDRESS_TYPE");
          if (iVar1 != 0) {
            return 0x4f8;
          }
          if (*(int *)((long)socket_io + 0x50) == 0) {
            iVar1 = strcmp((char *)value,"DOMAIN_SOCKET");
            if (iVar1 == 0) {
              *(undefined4 *)((long)socket_io + 4) = 1;
            }
            else {
              iVar1 = strcmp((char *)value,"IP_SOCKET");
              if (iVar1 != 0) {
                p_Var2 = xlogging_get_log_function();
                iVar1 = 0x4ac;
                if (p_Var2 == (LOGGER_LOG)0x0) {
                  return 0x4ac;
                }
                pcVar6 = "socketio_setaddresstype_option";
                pcVar7 = "Address type %s is not supported";
                iVar5 = 0x4ab;
                goto LAB_0011c5d9;
              }
              *(undefined4 *)((long)socket_io + 4) = 0;
            }
            return 0;
          }
          p_Var2 = xlogging_get_log_function();
          iVar1 = 0x49d;
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return 0x49d;
          }
          pcVar6 = "socketio_setaddresstype_option";
          pcVar7 = 
          "Socket\'s type can only be changed when in state \'IO_STATE_CLOSED\'.  Current state=%d";
          iVar5 = 0x49c;
        }
LAB_0011c5d9:
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/socketio_berkeley.c"
                  ,pcVar6,iVar5,1,pcVar7);
        return iVar1;
      }
      iVar1 = *socket_io;
      __level = 6;
      iVar5 = 5;
    }
  }
  iVar1 = setsockopt(iVar1,__level,iVar5,value,4);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
  }
  return iVar1;
}

Assistant:

int socketio_setoption(CONCRETE_IO_HANDLE socket_io, const char* optionName, const void* value)
{
    int result;

    if (socket_io == NULL ||
        optionName == NULL ||
        value == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOCKET_IO_INSTANCE* socket_io_instance = (SOCKET_IO_INSTANCE*)socket_io;

        if (strcmp(optionName, "tcp_keepalive") == 0)
        {
            result = setsockopt(socket_io_instance->socket, SOL_SOCKET, SO_KEEPALIVE, value, sizeof(int));
            if (result == -1) result = errno;
        }
        else if (strcmp(optionName, "tcp_keepalive_time") == 0)
        {
#ifdef __APPLE__
            result = setsockopt(socket_io_instance->socket, IPPROTO_TCP, TCP_KEEPALIVE, value, sizeof(int));
#else
            result = setsockopt(socket_io_instance->socket, SOL_TCP, TCP_KEEPIDLE, value, sizeof(int));
#endif
            if (result == -1) result = errno;
        }
        else if (strcmp(optionName, "tcp_keepalive_interval") == 0)
        {
            result = setsockopt(socket_io_instance->socket, SOL_TCP, TCP_KEEPINTVL, value, sizeof(int));
            if (result == -1) result = errno;
        }
        else if (strcmp(optionName, OPTION_NET_INT_MAC_ADDRESS) == 0)
        {
#ifdef __APPLE__
            LogError("option not supported.");
            result = MU_FAILURE;
#else
            size_t malloc_size;
            if (strlen(value) == 0)
            {
                LogError("option value must be a valid mac address");
                result = MU_FAILURE;
            }
            else if ((malloc_size = safe_multiply_size_t(safe_add_size_t(strlen(value), 1), sizeof(char))) == SIZE_MAX)
            {
                LogError("invalid malloc size");
                result = MU_FAILURE;
                socket_io_instance->target_mac_address = NULL;
            }
            else if ((socket_io_instance->target_mac_address = (char*)malloc(malloc_size)) == NULL)
            {
                LogError("failed setting net_interface_mac_address option (malloc failed)");
                result = MU_FAILURE;
            }
            else
            {
                strcpy(socket_io_instance->target_mac_address, value);
                strtoup(socket_io_instance->target_mac_address);
                result = 0;
            }
#endif
        }
        else if (strcmp(optionName, OPTION_ADDRESS_TYPE) == 0)
        {
            result = socketio_setaddresstype_option(socket_io_instance, (const char*)value);
        }
        else
        {
            result = MU_FAILURE;
        }
    }

    return result;
}